

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  VkFormat VVar1;
  VkDeviceSize VVar2;
  VkDeviceSize VVar3;
  Unique<vk::Handle<(vk::HandleType)12>_> obj3;
  Environment env;
  Unique<vk::Handle<(vk::HandleType)12>_> obj0;
  Resources res;
  Move<vk::Handle<(vk::HandleType)12>_> local_198;
  Move<vk::Handle<(vk::HandleType)12>_> local_178;
  Move<vk::Handle<(vk::HandleType)12>_> local_158;
  VkBufferViewCreateInfo local_138;
  Environment local_100;
  VkBufferView local_c8;
  Deleter<vk::Handle<(vk::HandleType)12>_> DStack_c0;
  Resources local_a8;
  Move<vk::Handle<(vk::HandleType)12>_> local_58;
  
  local_100.vkp = context->m_platformInterface;
  local_100.vkd = Context::getDeviceInterface(context);
  local_100.device = Context::getDevice(context);
  local_100.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_100.programBinaries = context->m_progCollection;
  local_100.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_100.maxResourceConsumers = 4;
  BufferView::Resources::Resources(&local_a8,&local_100,&params);
  VVar3 = params.range;
  VVar2 = params.offset;
  VVar1 = params.format;
  local_138.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_138.pNext = (void *)0x0;
  local_138.flags = 0;
  local_138.buffer.m_internal =
       local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_138.format = params.format;
  local_138.offset = params.offset;
  local_138.range = params.range;
  ::vk::createBufferView
            (&local_178,local_100.vkd,local_100.device,&local_138,local_100.allocationCallbacks);
  local_c8.m_internal =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  DStack_c0.m_deviceIface =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  DStack_c0.m_device =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  DStack_c0.m_allocator =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_138.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_138.pNext = (void *)0x0;
  local_138.flags = 0;
  local_138.buffer.m_internal =
       local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_138.format = VVar1;
  local_138.offset = VVar2;
  local_138.range = VVar3;
  ::vk::createBufferView
            (&local_198,local_100.vkd,local_100.device,&local_138,local_100.allocationCallbacks);
  local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_138.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_138.pNext = (void *)0x0;
  local_138.flags = 0;
  local_138.buffer.m_internal =
       local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_138.format = VVar1;
  local_138.offset = VVar2;
  local_138.range = VVar3;
  ::vk::createBufferView
            (&local_158,local_100.vkd,local_100.device,&local_138,local_100.allocationCallbacks);
  local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_138.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_138.pNext = (void *)0x0;
  local_138.flags = 0;
  local_138.buffer.m_internal =
       local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_138.format = params.format;
  local_138.offset = params.offset;
  local_138.range = params.range;
  ::vk::createBufferView
            (&local_58,local_100.vkd,local_100.device,&local_138,local_100.allocationCallbacks);
  local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  if (local_58.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_158.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_58.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  if (local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_198.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  if (local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_178.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()(&DStack_c0,local_c8);
  }
  local_138._0_8_ = (void *)((long)&local_138 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_138._0_8_,
             (long)local_138.pNext + local_138._0_8_);
  if ((void *)local_138._0_8_ != (void *)((long)&local_138 + 0x10U)) {
    operator_delete((void *)local_138._0_8_,CONCAT44(local_138._20_4_,local_138.flags) + 1);
  }
  if (local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}